

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

int testing::internal::GetRandomSeedFromFlag(Int32 random_seed_flag)

{
  TimeInMillis TVar1;
  int in_EDI;
  int normalized_seed;
  uint raw_seed;
  int local_10;
  
  local_10 = in_EDI;
  if (in_EDI == 0) {
    TVar1 = GetTimeInMillis();
    local_10 = (int)TVar1;
  }
  return (local_10 - 1U) % 99999 + 1;
}

Assistant:

inline int GetRandomSeedFromFlag(Int32 random_seed_flag) {
  const unsigned int raw_seed = (random_seed_flag == 0) ?
      static_cast<unsigned int>(GetTimeInMillis()) :
      static_cast<unsigned int>(random_seed_flag);

  // Normalizes the actual seed to range [1, kMaxRandomSeed] such that
  // it's easy to type.
  const int normalized_seed =
      static_cast<int>((raw_seed - 1U) %
                       static_cast<unsigned int>(kMaxRandomSeed)) + 1;
  return normalized_seed;
}